

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mpp_thread.cpp
# Opt level: O0

void __thiscall MppThread::start(MppThread *this)

{
  MppThreadStatus MVar1;
  int iVar2;
  undefined1 local_48 [4];
  RK_S32 ret;
  pthread_attr_t attr;
  MppThread *this_local;
  
  attr._48_8_ = this;
  pthread_attr_init((pthread_attr_t *)local_48);
  pthread_attr_setdetachstate((pthread_attr_t *)local_48,0);
  MVar1 = get_status(this,THREAD_WORK);
  if (MVar1 == MPP_THREAD_UNINITED) {
    set_status(this,MPP_THREAD_RUNNING,THREAD_WORK);
    iVar2 = pthread_create(&this->mThread,(pthread_attr_t *)local_48,
                           (__start_routine *)this->mFunction,this->mContext);
    if (iVar2 == 0) {
      iVar2 = pthread_setname_np(this->mThread,this->mName);
      if (iVar2 != 0) {
        _mpp_log_l(2,"mpp_thread","thread %p setname %s failed\n",(char *)0x0,this->mFunction,
                   this->mName);
      }
      if ((thread_debug & 1) != 0) {
        _mpp_log_l(4,"mpp_thread","thread %s %p context %p create success\n",(char *)0x0,this->mName
                   ,this->mFunction,this->mContext);
      }
    }
    else {
      set_status(this,MPP_THREAD_UNINITED,THREAD_WORK);
    }
  }
  pthread_attr_destroy((pthread_attr_t *)local_48);
  return;
}

Assistant:

void MppThread::start()
{
    pthread_attr_t attr;
    pthread_attr_init(&attr);
    pthread_attr_setdetachstate(&attr, PTHREAD_CREATE_JOINABLE);

    if (MPP_THREAD_UNINITED == get_status()) {
        // NOTE: set status here first to avoid unexpected loop quit racing condition
        set_status(MPP_THREAD_RUNNING);
        if (0 == pthread_create(&mThread, &attr, mFunction, mContext)) {
#ifndef ARMLINUX
            RK_S32 ret = pthread_setname_np(mThread, mName);
            if (ret)
                mpp_err("thread %p setname %s failed\n", mFunction, mName);
#endif

            thread_dbg(MPP_THREAD_DBG_FUNCTION, "thread %s %p context %p create success\n",
                       mName, mFunction, mContext);
        } else
            set_status(MPP_THREAD_UNINITED);
    }
    pthread_attr_destroy(&attr);
}